

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

void __thiscall
flatbuffers::JsonPrinter::PrintScalar<double>(JsonPrinter *this,double val,Type *type,int param_3)

{
  string *psVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  SymbolTable<flatbuffers::Value> *this_00;
  Value *pVVar5;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar6;
  reference ppEVar7;
  undefined1 *puVar8;
  EnumVal **ppEVar9;
  char *pcVar10;
  string local_c0;
  uint64_t local_a0;
  uint64_t f;
  const_iterator e;
  const_iterator it;
  uint64_t mask;
  uint64_t u64;
  size_type entry_len;
  allocator<char> local_59;
  string local_58;
  EnumVal *local_38;
  EnumVal *ev;
  EnumDef *enum_def;
  Type *pTStack_20;
  int param_3_local;
  Type *type_local;
  double val_local;
  JsonPrinter *this_local;
  
  enum_def._4_4_ = param_3;
  pTStack_20 = type;
  type_local = (Type *)val;
  val_local = (double)this;
  bVar4 = IsBool(type->base_type);
  if (bVar4) {
    pcVar10 = "false";
    if ((double)type_local != 0.0) {
      pcVar10 = "true";
    }
    std::__cxx11::string::operator+=((string *)this->text,pcVar10);
  }
  else {
    if (((this->opts->output_enum_identifiers & 1U) != 0) &&
       (pTStack_20->enum_def != (EnumDef *)0x0)) {
      ev = (EnumVal *)pTStack_20->enum_def;
      local_38 = EnumDef::ReverseLookup((EnumDef *)ev,(long)(double)type_local,false);
      if (local_38 != (EnumVal *)0x0) {
        std::__cxx11::string::operator+=((string *)this->text,'\"');
        std::__cxx11::string::operator+=((string *)this->text,(string *)local_38);
        std::__cxx11::string::operator+=((string *)this->text,'\"');
        return;
      }
      bVar3 = false;
      bVar2 = false;
      bVar4 = false;
      if (((double)type_local != 0.0) || (NAN((double)type_local))) {
        this_00 = &ev->attributes;
        std::allocator<char>::allocator();
        bVar3 = true;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"bit_flags",&local_59);
        bVar2 = true;
        pVVar5 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&local_58);
        bVar4 = pVVar5 != (Value *)0x0;
      }
      if (bVar2) {
        std::__cxx11::string::~string((string *)&local_58);
      }
      if (bVar3) {
        std::allocator<char>::~allocator(&local_59);
      }
      if (bVar4) {
        std::__cxx11::string::length();
        ppEVar9 = (EnumVal **)
                  ((long)(double)type_local |
                  (long)((double)type_local - 9.223372036854776e+18) &
                  (long)(double)type_local >> 0x3f);
        it._M_current = (EnumVal **)0x0;
        std::__cxx11::string::operator+=((string *)this->text,'\"');
        pvVar6 = EnumDef::Vals((EnumDef *)ev);
        e = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                      (pvVar6);
        pvVar6 = EnumDef::Vals((EnumDef *)ev);
        f = (uint64_t)
            std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                      (pvVar6);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&e,(__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                                      *)&f), bVar4) {
          ppEVar7 = __gnu_cxx::
                    __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                    ::operator*(&e);
          local_a0 = EnumVal::GetAsUInt64(*ppEVar7);
          if ((local_a0 & (ulong)ppEVar9) != 0) {
            it._M_current = local_a0 | it._M_current;
            ppEVar7 = __gnu_cxx::
                      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                      ::operator*(&e);
            std::__cxx11::string::operator+=((string *)this->text,(string *)*ppEVar7);
            std::__cxx11::string::operator+=((string *)this->text,' ');
          }
          __gnu_cxx::
          __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
          ::operator++(&e);
        }
        if ((it._M_current != (EnumVal **)0x0) && (ppEVar9 == it._M_current)) {
          psVar1 = this->text;
          std::__cxx11::string::length();
          puVar8 = (undefined1 *)std::__cxx11::string::operator[]((ulong)psVar1);
          *puVar8 = 0x22;
          return;
        }
        std::__cxx11::string::resize((ulong)this->text);
      }
    }
    NumToString<double>(&local_c0,(double)type_local);
    std::__cxx11::string::operator+=((string *)this->text,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  return;
}

Assistant:

void PrintScalar(T val, const Type &type, int /*indent*/) {
    if (IsBool(type.base_type)) {
      text += val != 0 ? "true" : "false";
      return;  // done
    }

    if (opts.output_enum_identifiers && type.enum_def) {
      const auto &enum_def = *type.enum_def;
      if (auto ev = enum_def.ReverseLookup(static_cast<int64_t>(val))) {
        text += '\"';
        text += ev->name;
        text += '\"';
        return;  // done
      } else if (val && enum_def.attributes.Lookup("bit_flags")) {
        const auto entry_len = text.length();
        const auto u64 = static_cast<uint64_t>(val);
        uint64_t mask = 0;
        text += '\"';
        for (auto it = enum_def.Vals().begin(), e = enum_def.Vals().end();
             it != e; ++it) {
          auto f = (*it)->GetAsUInt64();
          if (f & u64) {
            mask |= f;
            text += (*it)->name;
            text += ' ';
          }
        }
        // Don't slice if (u64 != mask)
        if (mask && (u64 == mask)) {
          text[text.length() - 1] = '\"';
          return;  // done
        }
        text.resize(entry_len);  // restore
      }
      // print as numeric value
    }

    text += NumToString(val);
    return;
  }